

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int need_value(FuncState *fs,int list)

{
  Instruction *pIVar1;
  uint uVar2;
  
  if (list != -1) {
    pIVar1 = fs->f->sp->code;
    do {
      if ((list < 1) || (uVar2 = pIVar1[(long)list + -1], -1 < (char)luaP_opmodes[uVar2 & 0x3f])) {
        uVar2 = pIVar1[list];
      }
      if ((uVar2 & 0x3f) != 0x23) {
        return 1;
      }
    } while ((pIVar1[list] >> 0xe != 0x1fffe) &&
            (list = list + (pIVar1[list] >> 0xe) + -0x1fffe, list != -1));
  }
  return 0;
}

Assistant:

static int need_value (FuncState *fs, int list) {
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    Instruction i = *getjumpcontrol(fs, list);
    if (GET_OPCODE(i) != OP_TESTSET) return 1;
  }
  return 0;  /* not found */
}